

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

uint64_t __thiscall wasm::Literal::getUnsigned(Literal *this)

{
  BasicType BVar1;
  Literal *this_local;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  if (BVar1 == i32) {
    this_local = (Literal *)(ulong)(uint)(this->field_0).i32;
  }
  else {
    if (BVar1 != i64) {
      abort();
    }
    this_local = (Literal *)
                 (this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t Literal::getUnsigned() const {
  switch (type.getBasic()) {
    case Type::i32:
      return static_cast<uint32_t>(i32);
    case Type::i64:
      return i64;
    default:
      abort();
  }
}